

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenumberarea.h
# Opt level: O0

int __thiscall LineNumArea::lineNumAreaWidth(LineNumArea *this)

{
  int iVar1;
  int *piVar2;
  QChar local_3a;
  QWidget local_38 [16];
  int local_28;
  int space;
  int local_20;
  int local_1c;
  int max;
  int digits;
  LineNumArea *this_local;
  
  if ((this->enabled & 1U) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_1c = 2;
    space = 1;
    _max = this;
    local_28 = QPlainTextEdit::blockCount();
    piVar2 = std::max<int>(&space,&local_28);
    for (local_20 = *piVar2; 9 < local_20; local_20 = local_20 / 10) {
      local_1c = local_1c + 1;
    }
    QWidget::fontMetrics(local_38);
    QChar::QChar(&local_3a,L'9');
    iVar1 = QFontMetrics::horizontalAdvance((QChar *)local_38);
    iVar1 = iVar1 * local_1c;
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_38);
    this_local._4_4_ = iVar1 + 0xd;
  }
  return this_local._4_4_;
}

Assistant:

int lineNumAreaWidth() const
    {
        if (!enabled) {
            return 0;
        }

        int digits = 2;
        int max = std::max(1, textEdit->blockCount());
        while (max >= 10) {
            max /= 10;
            ++digits;
        }

#if QT_VERSION >= 0x050B00
        int space = 13 + textEdit->fontMetrics().horizontalAdvance(u'9') * digits;
#else
        int space = 13 + textEdit->fontMetrics().width(QLatin1Char('9')) * digits;
#endif

        return space;
    }